

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O3

void __thiscall MetaSim::DebugStream::DebugStream(DebugStream *this)

{
  this->_os = (ostream *)&std::cerr;
  this->_autodelete = false;
  this->_isDebug = false;
  this->_isDebugAll = false;
  this->_isIndenting = false;
  this->_indentLevel = 0;
  (this->_dbgLevels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_dbgLevels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_dbgLevels).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_dbgStack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->_dbgStack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_dbgStack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->_dbgStack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_dbgStack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->_t1).v = 0;
  (this->_t2).v = 0x7fffffffffffffff;
  return;
}

Assistant:

DebugStream::DebugStream() : 
        _os(&cerr),
        _autodelete(false),
        _isDebug(false),
        _isDebugAll(false),
        _isIndenting(false),
        _indentLevel(0),
        _dbgLevels(),
        _dbgStack(),
        _t1(0),
        _t2(MAXTICK)
    {    
    }